

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  size_type sVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  undefined4 extraout_var;
  char *pcVar9;
  pointer *__ptr;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer __rhs;
  string langFlags;
  string responseFlag;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  cmNinjaRule rule;
  cmRulePlaceholderExpander *local_348;
  string local_340;
  string local_320;
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  string local_2a8;
  string local_288;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  char *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  char *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  bool local_148;
  RuleVariables local_140;
  
  LanguageLinkerDeviceRule_abi_cxx11_(&local_2a8,this);
  local_268._0_8_ = local_268 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == &local_2a8.field_2) {
    local_268._24_8_ = local_2a8.field_2._8_8_;
  }
  else {
    local_268._0_8_ = local_2a8._M_dataplus._M_p;
  }
  local_248._M_p = (pointer)&local_238;
  local_268._8_8_ = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = (char *)0x0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_p = (pointer)&local_1f8;
  local_200 = (char *)0x0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = (char *)0x0;
  local_198._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
  local_180 = (char *)0x0;
  local_178._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
  local_160 = (char *)0x0;
  local_158._M_local_buf[0] = '\0';
  local_148 = false;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar4 = cmGlobalNinjaGenerator::HasRule(pcVar7,(string *)local_268);
  if (!bVar4) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_140);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_140.CMTargetName = (psVar8->_M_dataplus)._M_p;
    TVar5 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    local_140.CMTargetType = cmState::GetTargetTypeName(TVar5);
    local_140.Language = "CUDA";
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,"CMAKE_CUDA_RESPONSE_FILE_LINK_FLAG","");
    psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_340);
    local_300 = local_2f0;
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,pcVar1,pcVar1 + psVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
    local_140.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    local_140.Objects = (char *)(long *)0x5bbccd;
    if ((useResponseFile) && (local_2f8 != 0)) {
      std::__cxx11::string::_M_replace((ulong)&local_1a8,0,local_1a0,0x5bba45);
      std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_1a8._M_p);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar9 = "$in_newline";
      if (pcVar7->UsingGCCOnWindows != false) {
        pcVar9 = "$in";
      }
      std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,(ulong)pcVar9);
      std::__cxx11::string::append((char *)&local_188);
      local_140.LinkLibraries = "";
      local_140.Objects = (char *)local_300;
    }
    local_140.ObjectDir = "$OBJECT_DIR";
    local_140.Target = "$TARGET_FILE";
    local_140.SONameFlag = "$SONAME_FLAG";
    local_140.TargetSOName = "$SONAME";
    local_140.TargetPDB = "$TARGET_PDB";
    local_140.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_140.Flags = "$FLAGS";
    local_140.LinkFlags = "$LINK_FLAGS";
    local_140.Manifests = "$MANIFESTS";
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    TVar5 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar5 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&local_340);
      local_140.LanguageCompileFlags = local_340._M_dataplus._M_p;
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    local_2e0._M_string_length = 0;
    local_2e0.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"RULE_LAUNCH_LINK","");
    pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,target,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    sVar3 = local_2e0._M_string_length;
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&local_2e0,0,(char *)sVar3,(ulong)pcVar9);
      std::__cxx11::string::append((char *)&local_2e0);
    }
    iVar6 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    local_348 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar6);
    ComputeDeviceLinkCmd_abi_cxx11_(&local_2c0,this);
    if (local_2c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs = local_2c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::operator+(&local_320,&local_2e0,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        outputConverter =
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
        if (pcVar2 == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables(local_348,outputConverter,__rhs,&local_140);
        __rhs = __rhs + 1;
      } while (__rhs != local_2c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&local_2c0);
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_320,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_2c0,&local_288,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_248,(string *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_208,0,local_200,0x5bc01e);
    std::__cxx11::string::_M_append
              ((char *)&local_208,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_208);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)&local_208);
    std::__cxx11::string::append((char *)&local_208);
    std::__cxx11::string::_M_replace((ulong)&local_228,0,local_220,0x5bc030);
    std::__cxx11::string::_M_append
              ((char *)&local_228,(ulong)(this->TargetLinkLanguage)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_228);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)&local_228);
    std::__cxx11::string::append((char *)&local_228);
    std::__cxx11::string::_M_replace((ulong)&local_168,0,local_160,0x5bc039);
    pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c0);
    if (local_348 != (cmRulePlaceholderExpander *)0x0) {
      std::default_delete<cmRulePlaceholderExpander>::operator()
                ((default_delete<cmRulePlaceholderExpander> *)&local_348,local_348);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                               local_2e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
    if (local_300 != local_2f0) {
      operator_delete(local_300,local_2f0[0] + 1);
    }
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_268);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRule(bool useResponseFile)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule());
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = "CUDA";

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (this->GetGeneratorTarget()->GetType() != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command = this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    rule.Comment = "Rule for linking ";
    rule.Comment += this->TargetLinkLanguage;
    rule.Comment += " ";
    rule.Comment += this->GetVisibleTypeName();
    rule.Comment += ".";
    rule.Description = "Linking ";
    rule.Description += this->TargetLinkLanguage;
    rule.Description += " ";
    rule.Description += this->GetVisibleTypeName();
    rule.Description += " $TARGET_FILE";
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}